

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall QSocks5SocketEnginePrivate::emitWriteNotification(QSocks5SocketEnginePrivate *this)

{
  QSocks5SocketEnginePrivate *in_RDI;
  char *unaff_retaddr;
  QSocks5SocketEngine *q;
  QSocks5SocketEnginePrivate *pQVar1;
  
  pQVar1 = in_RDI;
  q_func(in_RDI);
  in_RDI->writeNotificationActivated = true;
  if (((in_RDI->writeNotificationEnabled & 1U) != 0) &&
     ((in_RDI->writeNotificationPending & 1U) == 0)) {
    in_RDI->writeNotificationPending = true;
    QMetaObject::invokeMethod<>((QObject *)q,unaff_retaddr,(ConnectionType)((ulong)pQVar1 >> 0x20));
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::emitWriteNotification()
{
    Q_Q(QSocks5SocketEngine);
    writeNotificationActivated = true;
    if (writeNotificationEnabled && !writeNotificationPending) {
        QSOCKS5_D_DEBUG << "queueing writeNotification";
        writeNotificationPending = true;
        QMetaObject::invokeMethod(q, "_q_emitPendingWriteNotification", Qt::QueuedConnection);
    }
}